

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteKvIopageWrite(unqlite_page *pPage)

{
  Pager *pPager;
  unqlite_file *pChunk;
  SyMemBackend *pBackend;
  Page *pPVar1;
  Page *pPVar2;
  int iVar3;
  uint uVar4;
  sxu32 sVar5;
  int iVar6;
  Page *pPVar7;
  uchar *zBuf;
  ulong uVar8;
  long lVar9;
  Page **ppPVar10;
  char *zErr;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  int local_144;
  Page **local_140;
  undefined8 local_138;
  Page *local_130 [32];
  
  if (pPage == (unqlite_page *)0x0) {
LAB_0011631c:
    iVar6 = 0;
  }
  else {
    pPager = (Pager *)pPage[1].zData;
    iVar3 = unqlitePagerBegin(pPager);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (pPager->iState == 2) {
      iVar3 = 0;
      if ((pPager->is_mem == 0) && (pPager->no_jrnl == 0)) {
        (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
        iVar3 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,&pPager->pjfd,6);
        if (iVar3 == 0) {
          zBuf = (uchar *)SyMemBackendAlloc(pPager->pAllocator,pPager->iSectorSize);
          if (zBuf != (uchar *)0x0) {
            pager_write_journal_header(pPager,zBuf);
            iVar3 = (*pPager->pjfd->pMethods->xWrite)(pPager->pjfd,zBuf,(long)pPager->iSectorSize,0)
            ;
            pPager->iJournalOfft = (long)pPager->iSectorSize;
            SyMemBackendFree(pPager->pAllocator,zBuf);
            goto LAB_00115e83;
          }
          iVar3 = -1;
          goto LAB_00115e88;
        }
        unqliteGenErrorFormat
                  (pPager->pDb,"IO error while opening journal file: %s",pPager->zJournal);
      }
      else {
LAB_00115e83:
        if (iVar3 == 0) {
          pPager->iState = 3;
          iVar3 = 0;
        }
        else {
LAB_00115e88:
          pChunk = pPager->pjfd;
          if (pChunk != (unqlite_file *)0x0) {
            pBackend = pPager->pAllocator;
            (*pChunk->pMethods->xClose)(pChunk);
            SyMemBackendFree(pBackend,pChunk);
          }
          (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,0);
          pPager->pjfd = (unqlite_file *)0x0;
        }
      }
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    if (pPager->nHot < 0x80) {
LAB_00115f60:
      if ((((pPager->is_mem == 0) && (pPager->no_jrnl == 0)) &&
          (uVar8 = pPage->iPage, uVar8 < pPager->dbOrigSize)) &&
         (iVar3 = unqliteBitvecTest(pPager->pVec,uVar8), iVar3 == 0)) {
        if (pPager->nRec == 0xffffffff) {
          unqliteGenError(pPager->pDb,"Journal record limit reached, commit your changes");
          uVar12 = 0xfffffff9;
LAB_0011629e:
          bVar13 = false;
          uVar8 = uVar12;
        }
        else {
          uVar4 = WriteInt64(pPager->pjfd,uVar8,pPager->iJournalOfft);
          uVar12 = (ulong)uVar4;
          if (uVar4 != 0) goto LAB_0011629e;
          uVar4 = (*pPager->pjfd->pMethods->xWrite)
                            (pPager->pjfd,pPage->zData,(long)pPager->iPageSize,
                             pPager->iJournalOfft + 8);
          uVar12 = (ulong)uVar4;
          if (uVar4 != 0) goto LAB_0011629e;
          sVar5 = pPager->cksumInit;
          lVar9 = (long)pPager->iPageSize;
          if (200 < lVar9) {
            lVar11 = lVar9 + 200;
            do {
              sVar5 = sVar5 + pPage->zData[lVar11 + -400];
              lVar11 = lVar11 + -200;
            } while (400 < lVar11);
          }
          local_138._0_4_ =
               sVar5 >> 0x18 | (sVar5 & 0xff0000) >> 8 | (sVar5 & 0xff00) << 8 | sVar5 << 0x18;
          uVar4 = (*pPager->pjfd->pMethods->xWrite)
                            (pPager->pjfd,&local_138,4,lVar9 + pPager->iJournalOfft + 8);
          uVar12 = (ulong)uVar4;
          if (uVar4 != 0) goto LAB_0011629e;
          pPager->iJournalOfft = (long)pPager->iPageSize + pPager->iJournalOfft + 0xc;
          pPager->nRec = pPager->nRec + 1;
          unqliteBitvecSet(pPager->pVec,pPage->iPage);
          bVar13 = true;
        }
        if (!bVar13) {
          return (int)uVar8;
        }
      }
      if ((*(uint *)&pPage[1].pUserData & 2) == 0) {
        *(uint *)&pPage[1].pUserData = *(uint *)&pPage[1].pUserData | 0x26;
        pPage[2].iPage = 0;
        pPVar7 = pPager->pDirty;
        pPage[2].pUserData = pPVar7;
        if (pPVar7 != (Page *)0x0) {
          pPVar7->pDirtyPrev = (Page *)pPage;
        }
        pPager->pDirty = (Page *)pPage;
        if (pPager->pFirstDirty == (Page *)0x0) {
          pPager->pFirstDirty = (Page *)pPage;
        }
      }
      uVar8 = pPage->iPage + 1;
      if (uVar8 <= pPager->dbSize) goto LAB_0011631c;
      pPager->dbSize = uVar8;
      if (uVar8 != 0xffffffffffffffff) {
        return 0;
      }
      iVar6 = -7;
      zErr = "Database maximum page limit (64-bit) reached";
    }
    else {
      local_144 = 0;
      iVar6 = 0;
      iVar3 = unqliteFinalizeJournal(pPager,&local_144,0);
      if (iVar3 == 0) {
        pPVar7 = pPager->pFirstHot;
        iVar6 = 0;
        if (pPVar7 == (Page *)0x0) {
          pPVar7 = (Page *)0x0;
        }
        else {
          memset(&local_138,0,0x100);
          do {
            pPVar1 = pPVar7->pPrevHot;
            pPVar7->pPrevHot = (Page *)0x0;
            lVar9 = 0;
            do {
              if (local_130[lVar9 + -1] == (Page *)0x0) {
                local_130[lVar9 + -1] = pPVar7;
                bVar13 = lVar9 == 0x1f;
                goto LAB_001160c2;
              }
              pPVar7 = page_merge_hot(local_130[lVar9 + -1],pPVar7);
              local_130[lVar9 + -1] = (Page *)0x0;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x1f);
            bVar13 = true;
LAB_001160c2:
            if (bVar13) {
              local_130[0x1e] = page_merge_hot(local_130[0x1e],pPVar7);
            }
            pPVar7 = pPVar1;
          } while (pPVar1 != (Page *)0x0);
          lVar9 = 1;
          pPVar7 = (Page *)CONCAT44(local_138._4_4_,(uint)local_138);
          do {
            pPVar7 = page_merge_hot(pPVar7,local_130[lVar9 + -1]);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x20);
          pPVar7->pNextHot = (Page *)0x0;
        }
        if ((pPVar7 != (Page *)0x0) &&
           ((local_144 == 0 || (iVar3 = pager_wait_on_lock(pPager,4), iVar3 == 0)))) {
          *(byte *)&pPager->iFlags = (byte)pPager->iFlags | 2;
          local_140 = &pPager->pDirty;
          do {
            pPVar1 = pPVar7->pPrevHot;
            if (((pPVar7->flags & 8) == 0) &&
               (iVar6 = (*pPager->pfd->pMethods->xWrite)
                                  (pPager->pfd,pPVar7->zData,(long)pPager->iPageSize,
                                   pPVar7->pgno * (long)pPager->iPageSize), iVar6 != 0))
            goto LAB_00116240;
            *(byte *)&pPVar7->flags = (byte)pPVar7->flags & 0x91;
            pPVar2 = pPVar7->pDirtyPrev;
            ppPVar10 = &pPVar2->pDirtyNext;
            if (pPVar2 == (Page *)0x0) {
              ppPVar10 = local_140;
            }
            *ppPVar10 = pPVar7->pDirtyNext;
            ppPVar10 = &pPVar7->pDirtyNext->pDirtyPrev;
            if (pPVar7->pDirtyNext == (Page *)0x0) {
              ppPVar10 = &pPager->pFirstDirty;
            }
            *ppPVar10 = pPVar2;
            pager_unlink_page(pPager,pPVar7);
            pager_release_page(pPager,pPVar7);
            pPVar7 = pPVar1;
          } while (pPVar1 != (Page *)0x0);
          iVar6 = 0;
LAB_00116240:
          if (iVar6 == 0) {
            pPager->pHotDirty = (Page *)0x0;
            pPager->pFirstHot = (Page *)0x0;
            pPager->nHot = 0;
            iVar6 = 0;
          }
          else {
            *(byte *)&pPager->iFlags = (byte)pPager->iFlags | 1;
            unqliteGenError(pPager->pDb,
                            "IO error while writing hot dirty pages, rollback your database");
          }
        }
      }
      if (iVar6 == 0) goto LAB_00115f60;
      zErr = "Please perform a rollback";
    }
    unqliteGenError(pPager->pDb,zErr);
  }
  return iVar6;
}

Assistant:

static int unqliteKvIopageWrite(unqlite_page *pPage)
{
	int rc;
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	rc = unqlitePageWrite(pPage);
	return rc;
}